

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32FloatWaveGenerator.cpp
# Opt level: O0

void __thiscall
MT32Emu::LA32FloatPartialPair::initPCM
          (LA32FloatPartialPair *this,PairType useMaster,Bit16s *pcmWaveAddress,Bit32u pcmWaveLength
          ,bool pcmWaveLooped)

{
  bool pcmWaveLooped_local;
  Bit32u pcmWaveLength_local;
  Bit16s *pcmWaveAddress_local;
  PairType useMaster_local;
  LA32FloatPartialPair *this_local;
  
  if (useMaster == MASTER) {
    LA32FloatWaveGenerator::initPCM(&this->master,pcmWaveAddress,pcmWaveLength,pcmWaveLooped,true);
  }
  else {
    LA32FloatWaveGenerator::initPCM
              (&this->slave,pcmWaveAddress,pcmWaveLength,pcmWaveLooped,
               (bool)((this->ringModulated ^ 0xffU) & 1));
  }
  return;
}

Assistant:

void LA32FloatPartialPair::initPCM(const PairType useMaster, const Bit16s *pcmWaveAddress, const Bit32u pcmWaveLength, const bool pcmWaveLooped) {
	if (useMaster == MASTER) {
		master.initPCM(pcmWaveAddress, pcmWaveLength, pcmWaveLooped, true);
	} else {
		slave.initPCM(pcmWaveAddress, pcmWaveLength, pcmWaveLooped, !ringModulated);
	}
}